

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddWatchOnlyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CScript *dest)

{
  WalletStorage *pWVar1;
  bool bVar2;
  mapped_type *keyMeta;
  long in_FS_OFFSET;
  CScriptID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LegacyDataSPKM::AddWatchOnlyInMem(&this->super_LegacyDataSPKM,dest);
  CScriptID::CScriptID(&local_4c,dest);
  keyMeta = std::
            map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
            ::operator[](&(this->super_LegacyDataSPKM).m_script_metadata,&local_4c);
  UpdateTimeFirstKey(this,keyMeta->nCreateTime);
  boost::signals2::
  signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyWatchonlyChanged,true);
  bVar2 = WalletBatch::WriteWatchOnly(batch,dest,keyMeta);
  if (bVar2) {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddWatchOnlyWithDB(WalletBatch &batch, const CScript& dest)
{
    if (!AddWatchOnlyInMem(dest))
        return false;
    const CKeyMetadata& meta = m_script_metadata[CScriptID(dest)];
    UpdateTimeFirstKey(meta.nCreateTime);
    NotifyWatchonlyChanged(true);
    if (batch.WriteWatchOnly(dest, meta)) {
        m_storage.UnsetBlankWalletFlag(batch);
        return true;
    }
    return false;
}